

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceMatrix4x4.cpp
# Opt level: O0

Matrix4x4 * __thiscall IceMaths::Matrix4x4::Invert(Matrix4x4 *this)

{
  float fVar1;
  float fVar2;
  float IDet;
  float local_68;
  Matrix4x4 Temp;
  float Det;
  Matrix4x4 *this_local;
  
  unique0x100001b7 = this;
  Temp.m[3][2] = Determinant(this);
  if (1e-07 <= ABS(Temp.m[3][2])) {
    fVar1 = 1.0 / Temp.m[3][2];
    fVar2 = CoFactor(this,0,0);
    IDet = fVar2 * fVar1;
    fVar2 = CoFactor(this,0,1);
    Temp.m[0][2] = fVar2 * fVar1;
    fVar2 = CoFactor(this,0,2);
    Temp.m[1][2] = fVar2 * fVar1;
    fVar2 = CoFactor(this,0,3);
    Temp.m[2][2] = fVar2 * fVar1;
    local_68 = CoFactor(this,1,0);
    local_68 = local_68 * fVar1;
    fVar2 = CoFactor(this,1,1);
    Temp.m[0][3] = fVar2 * fVar1;
    fVar2 = CoFactor(this,1,2);
    Temp.m[1][3] = fVar2 * fVar1;
    fVar2 = CoFactor(this,1,3);
    Temp.m[2][3] = fVar2 * fVar1;
    fVar2 = CoFactor(this,2,0);
    Temp.m[0][0] = fVar2 * fVar1;
    fVar2 = CoFactor(this,2,1);
    Temp.m[1][0] = fVar2 * fVar1;
    fVar2 = CoFactor(this,2,2);
    Temp.m[2][0] = fVar2 * fVar1;
    fVar2 = CoFactor(this,2,3);
    Temp.m[3][0] = fVar2 * fVar1;
    fVar2 = CoFactor(this,3,0);
    Temp.m[0][1] = fVar2 * fVar1;
    fVar2 = CoFactor(this,3,1);
    Temp.m[1][1] = fVar2 * fVar1;
    fVar2 = CoFactor(this,3,2);
    Temp.m[2][1] = fVar2 * fVar1;
    fVar2 = CoFactor(this,3,3);
    Temp.m[3][1] = fVar2 * fVar1;
    memcpy(this,&IDet,0x40);
  }
  return this;
}

Assistant:

Matrix4x4& Matrix4x4::Invert()
{
	float Det = Determinant();
	Matrix4x4 Temp;

	if(fabsf(Det) < MATRIX4X4_EPSILON)
		return	*this;		// The matrix is not invertible! Singular case!

	float IDet = 1.0f / Det;

	Temp.m[0][0] = CoFactor(0,0) * IDet;
	Temp.m[1][0] = CoFactor(0,1) * IDet;
	Temp.m[2][0] = CoFactor(0,2) * IDet;
	Temp.m[3][0] = CoFactor(0,3) * IDet;
	Temp.m[0][1] = CoFactor(1,0) * IDet;
	Temp.m[1][1] = CoFactor(1,1) * IDet;
	Temp.m[2][1] = CoFactor(1,2) * IDet;
	Temp.m[3][1] = CoFactor(1,3) * IDet;
	Temp.m[0][2] = CoFactor(2,0) * IDet;
	Temp.m[1][2] = CoFactor(2,1) * IDet;
	Temp.m[2][2] = CoFactor(2,2) * IDet;
	Temp.m[3][2] = CoFactor(2,3) * IDet;
	Temp.m[0][3] = CoFactor(3,0) * IDet;
	Temp.m[1][3] = CoFactor(3,1) * IDet;
	Temp.m[2][3] = CoFactor(3,2) * IDet;
	Temp.m[3][3] = CoFactor(3,3) * IDet;

	*this = Temp;

	return	*this;
}